

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.h
# Opt level: O0

byte_view * __thiscall winmd::reader::byte_view::operator=(byte_view *this,byte_view *other)

{
  uchar *puVar1;
  uchar *local_28;
  uchar *local_20;
  byte_view *local_18;
  byte_view *other_local;
  byte_view *this_local;
  
  local_20 = (uchar *)0x0;
  local_18 = other;
  other_local = this;
  puVar1 = std::exchange<unsigned_char_const*,unsigned_char_const*>(&other->m_first,&local_20);
  this->m_first = puVar1;
  local_28 = (uchar *)0x0;
  puVar1 = std::exchange<unsigned_char_const*,unsigned_char_const*>(&local_18->m_last,&local_28);
  this->m_last = puVar1;
  return this;
}

Assistant:

byte_view& operator=(byte_view&& other) noexcept
        {
            m_first = std::exchange(other.m_first, {});
            m_last = std::exchange(other.m_last, {});
            return *this;
        }